

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spikeestimator.cxx
# Opt level: O3

Matrix * __thiscall SpikeEstimator::getSample(Matrix *__return_storage_ptr__,SpikeEstimator *this)

{
  size_type *psVar1;
  size_type *psVar2;
  double dVar3;
  pointer pcVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  _func_int *p_Var9;
  ulong uVar10;
  Graph a;
  _func_int **local_428;
  long local_420;
  _func_int *local_418 [2];
  long *local_408;
  long local_400;
  long local_3f8;
  long lStack_3f0;
  long *local_3e8 [2];
  long local_3d8 [2];
  undefined1 local_3c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_3b0 [14];
  Matrix local_2c8;
  Matrix local_1c8;
  Physical local_c8;
  
  Matrix::Matrix(&local_1c8,this->spkLength,2);
  local_1c8.super_Physical._vptr_Physical = (_func_int **)&PTR__Matrix_0015b990;
  pcVar4 = (this->spkA->super_StochasticVariable).super_StochasticProcess.super_Parametric.
           parametricName._M_dataplus._M_p;
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3e8,pcVar4,
             pcVar4 + (this->spkA->super_StochasticVariable).super_StochasticProcess.
                      super_Parametric.parametricName._M_string_length);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_3e8,0,(char *)0x0,0x14d3fe);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_3f8 = *plVar7;
    lStack_3f0 = plVar5[3];
    local_408 = &local_3f8;
  }
  else {
    local_3f8 = *plVar7;
    local_408 = (long *)*plVar5;
  }
  local_400 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_408);
  psVar2 = &local_2c8.super_Physical.physicalDescription._M_string_length;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((size_type *)*plVar5 == puVar8) {
    local_2c8.super_Physical.physicalDescription._M_string_length = *puVar8;
    local_2c8.super_Physical.physicalDescription.field_2._M_allocated_capacity._0_4_ =
         (undefined4)plVar5[3];
    local_2c8.super_Physical.physicalDescription.field_2._M_allocated_capacity._4_4_ =
         *(undefined4 *)((long)plVar5 + 0x1c);
    local_2c8.super_Physical._vptr_Physical = (_func_int **)psVar2;
  }
  else {
    local_2c8.super_Physical.physicalDescription._M_string_length = *puVar8;
    local_2c8.super_Physical._vptr_Physical = (_func_int **)*plVar5;
  }
  local_2c8.super_Physical.physicalDescription._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar4 = (this->spkB->super_StochasticVariable).super_StochasticProcess.super_Parametric.
           parametricName._M_dataplus._M_p;
  local_428 = local_418;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_428,pcVar4,
             pcVar4 + (this->spkB->super_StochasticVariable).super_StochasticProcess.
                      super_Parametric.parametricName._M_string_length);
  p_Var9 = (_func_int *)0xf;
  if (local_2c8.super_Physical._vptr_Physical != (_func_int **)psVar2) {
    p_Var9 = (_func_int *)local_2c8.super_Physical.physicalDescription._M_string_length;
  }
  if (p_Var9 < local_2c8.super_Physical.physicalDescription._M_dataplus._M_p + local_420) {
    p_Var9 = (_func_int *)0xf;
    if (local_428 != local_418) {
      p_Var9 = local_418[0];
    }
    if (local_2c8.super_Physical.physicalDescription._M_dataplus._M_p + local_420 <= p_Var9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_428,0,(char *)0x0,
                          (ulong)local_2c8.super_Physical._vptr_Physical);
      goto LAB_001463a8;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_428);
LAB_001463a8:
  local_3c8._0_8_ = local_3c8 + 0x10;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    local_3c8._16_8_ = *psVar1;
    aaStack_3b0[0]._0_8_ = puVar6[3];
  }
  else {
    local_3c8._16_8_ = *psVar1;
    local_3c8._0_8_ = (size_type *)*puVar6;
  }
  local_3c8._8_8_ = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  Matrix::setName(&local_1c8,(string *)local_3c8);
  if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  if (local_428 != local_418) {
    operator_delete(local_428,(ulong)(local_418[0] + 1));
  }
  if (local_2c8.super_Physical._vptr_Physical != (_func_int **)psVar2) {
    operator_delete(local_2c8.super_Physical._vptr_Physical,
                    (ulong)(local_2c8.super_Physical.physicalDescription._M_string_length + 1));
  }
  if (local_408 != &local_3f8) {
    operator_delete(local_408,local_3f8 + 1);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  Physical::Physical(&local_c8,&((this->super_Estimator).estimatorTime)->super_Physical);
  Matrix::setPhysical(&local_1c8,0,&local_c8);
  Physical::~Physical(&local_c8);
  if (this->spkLength != 0) {
    uVar10 = 0;
    do {
      dVar3 = ((this->super_Estimator).estimatorTime)->dt;
      Matrix::operator[](&local_2c8,&local_1c8,(int)uVar10);
      Matrix::operator[]((Matrix *)local_3c8,&local_2c8,0);
      Matrix::operator=((Matrix *)local_3c8,(double)(uVar10 & 0xffffffff) * dVar3);
      Matrix::~Matrix((Matrix *)local_3c8);
      Matrix::~Matrix(&local_2c8);
      dVar3 = this->spkSample[uVar10];
      Matrix::operator[](&local_2c8,&local_1c8,(int)uVar10);
      Matrix::operator[]((Matrix *)local_3c8,&local_2c8,1);
      Matrix::operator=((Matrix *)local_3c8,dVar3);
      Matrix::~Matrix((Matrix *)local_3c8);
      Matrix::~Matrix(&local_2c8);
      uVar10 = uVar10 + 1;
    } while (uVar10 < this->spkLength);
  }
  Matrix::Matrix(__return_storage_ptr__,&local_1c8);
  Matrix::~Matrix(&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

Matrix SpikeEstimator::getSample()
{
    Graph a{int(spkLength)};
    a.setName("O-SPIKE measure " + spkA->getName() + " - " + spkB->getName());
    a.setPhysical(0, *estimatorTime );

    for(uint i=0; i<spkLength; i++) {
        a[int(i)][0] = double(i) * estimatorTime->dt;
        a[int(i)][1] = spkSample[i];
    }

    return a;
}